

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell::createTest
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_TestShell *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test *this_00;
  
  this_00 = (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x10f);
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test::
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNew_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNew)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char[100];
    CHECK(cpputestHasCrashed);
    delete [] memory;
    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}